

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void Style2Rule(TidyDocImpl *doc,Node *node)

{
  AttVal *attr;
  ctmbstr str;
  AttVal *classattr_00;
  tmbstr ptVar1;
  ctmbstr classname;
  AttVal *classattr;
  AttVal *styleattr;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  attr = prvTidyAttrGetById(node,TidyAttr_STYLE);
  if (attr != (AttVal *)0x0) {
    if (attr->value == (tmbstr)0x0) {
      prvTidyRemoveAttribute(doc,node,attr);
    }
    else {
      str = FindStyle(doc,node->element,attr->value);
      classattr_00 = prvTidyAttrGetById(node,TidyAttr_CLASS);
      if (classattr_00 == (AttVal *)0x0) {
        (*doc->allocator->vtbl->free)(doc->allocator,attr->attribute);
        (*doc->allocator->vtbl->free)(doc->allocator,attr->value);
        ptVar1 = prvTidytmbstrdup(doc->allocator,"class");
        attr->attribute = ptVar1;
        ptVar1 = prvTidytmbstrdup(doc->allocator,str);
        attr->value = ptVar1;
      }
      else {
        prvTidyAppendToClassAttr(doc,classattr_00,str);
        prvTidyRemoveAttribute(doc,node,attr);
      }
    }
  }
  return;
}

Assistant:

static void Style2Rule( TidyDocImpl* doc, Node *node)
{
    AttVal *styleattr, *classattr;
    ctmbstr classname;

    styleattr = TY_(AttrGetById)(node, TidyAttr_STYLE);

    if (styleattr)
    {
        /* fix for http://tidy.sf.net/bug/850215 */
        if (!styleattr->value)
        {
            TY_(RemoveAttribute)(doc, node, styleattr);
            return;
        }

        classname = FindStyle( doc, node->element, styleattr->value );
        classattr = TY_(AttrGetById)(node, TidyAttr_CLASS);

        /*
         if there already is a class attribute
         then append class name after an underscore
        */
        if (classattr)
        {
            TY_(AppendToClassAttr)( doc, classattr, classname );
            TY_(RemoveAttribute)( doc, node, styleattr );
        }
        else /* reuse style attribute for class attribute */
        {
            TidyDocFree(doc, styleattr->attribute);
            TidyDocFree(doc, styleattr->value);
            styleattr->attribute = TY_(tmbstrdup)(doc->allocator, "class");
            styleattr->value = TY_(tmbstrdup)(doc->allocator, classname);
        }
    }
}